

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reader.cpp
# Opt level: O1

int __thiscall ninx::lexer::Reader::get_next_limiter(Reader *this)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  bool bVar5;
  
  iVar2 = std::istream::peek();
  if (iVar2 < 0) {
    iVar4 = -1;
  }
  else {
    iVar4 = -2;
    if (iVar2 != 0x5c) {
      if (iVar2 == 0x2f) {
        bVar1 = ignore_comment(this);
        if (bVar1) {
          iVar2 = get_next_limiter(this);
          return iVar2;
        }
      }
      else if (iVar2 == 0x2d) {
        std::istream::get();
        iVar2 = std::istream::peek();
        if (iVar2 - 0x30U < 10) {
          std::istream::seekg((long)this->stream,~_S_beg);
          return -2;
        }
        ignore_spaces(this);
        return 0x2d;
      }
      bVar1 = false;
      lVar3 = 0;
      do {
        if ((&LIMITER_CHARS)[lVar3] == (char)iVar2) {
          bVar1 = true;
          break;
        }
        bVar5 = lVar3 != 0x11;
        lVar3 = lVar3 + 1;
      } while (bVar5);
      iVar4 = -2;
      if (bVar1) {
        std::istream::get();
        iVar4 = iVar2;
        if ((iVar2 == 0x3d) || (iVar2 == 0x7d)) {
          ignore_spaces(this);
        }
        else if (iVar2 == 0x7b) {
          ignore_spaces_and_newline(this,-1);
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int ninx::lexer::Reader::get_next_limiter() {
    int next_char = this->stream.peek();
    if (next_char >= 0) {
        if (next_char == '\\') {  // Escape char check
            return FOUND_TEXT;
        }else{
            if(next_char == '-') {  // Negative number handling
                this->stream.get();

                // Check if the next entry is a digit
                if (isdigit(this->stream.peek())) {
                    this->stream.seekg(-1, std::ios_base::cur);
                    return FOUND_TEXT;
                }

                // Also ignore the trailing spaces
                this->ignore_spaces();

                return next_char;
            }

            if (next_char == '/') {  // Comments handling
                bool comments_ignored { this->ignore_comment() };
                if (comments_ignored) {
                    return this->get_next_limiter();
                }
            }

            // Check if the char is a limiter
            if (is_limiter(static_cast<char>(next_char))) {
                // If the char is a limiter, consume it
                this->stream.get();

                // Also ignore the trailing spaces
                // Check if it is the beginning of a block, in that case remove also the new lines
                if (next_char == '{') {
                    this->ignore_spaces_and_newline();
                }else if (next_char == '}') {
                    this->ignore_spaces();
                }else if (next_char == '='){
                    this->ignore_spaces();
                }

                return next_char;
            }else{
                return FOUND_TEXT;
            }
        }
    }else{  // EOF
        return FOUND_EOF;
    }
}